

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_storage.cpp
# Opt level: O2

int __thiscall
libtorrent::aux::mmap_storage::hash
          (mmap_storage *this,settings_interface *sett,hasher *ph,ptrdiff_t len,piece_index_t piece,
          int offset,open_mode_t mode,disk_job_flags_t flags,storage_error *error)

{
  pointer psVar1;
  long lVar2;
  long lVar3;
  span<const_char> range;
  bool bVar4;
  undefined1 uVar5;
  open_mode_t mode_00;
  file_index_t fVar6;
  int iVar7;
  uint uVar8;
  int64_t iVar9;
  size_type sVar10;
  int iVar11;
  mmap_storage *f;
  file_storage *pfVar12;
  storage_error *ec;
  size_type __new_size;
  file_storage *this_00;
  size_type sVar13;
  long lVar14;
  span<const_char> range_00;
  span<const_char> data;
  span<char> buf;
  peer_request pVar15;
  shared_ptr<libtorrent::aux::file_mapping> handle;
  int local_8c;
  disk_job *local_80;
  char *local_78;
  size_type local_70;
  vector<char,_std::allocator<char>_> scratch;
  hasher *local_40;
  file_storage *local_38;
  
  scratch.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  scratch.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  scratch.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  this_00 = (this->m_mapped_files)._M_t.
            super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
            .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
  if (this_00 == (file_storage *)0x0) {
    this_00 = this->m_files;
  }
  lVar14 = (long)offset + (long)this_00->m_piece_length * (long)piece.m_val;
  mode_00.m_val = (uint)file_storage::file_index_at_offset(this_00,lVar14);
  iVar9 = file_storage::file_offset(this_00,(file_index_t)mode_00.m_val);
  lVar14 = lVar14 - iVar9;
  local_8c = 0;
  local_80 = (disk_job *)len;
  do {
    if ((long)local_80 < 1) {
LAB_00216288:
      ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&scratch.super__Vector_base<char,_std::allocator<char>_>);
      return local_8c;
    }
    iVar9 = file_storage::file_size(this_00,(file_index_t)mode_00.m_val);
    iVar7 = (int)local_80;
    iVar11 = iVar7;
    if (iVar9 < lVar14 + iVar7) {
      iVar9 = file_storage::file_size(this_00,(file_index_t)mode_00.m_val);
      iVar11 = (int)iVar9 - (int)lVar14;
      if (iVar11 < 1) {
        iVar11 = 0;
      }
    }
    if (iVar11 == 0) {
      do {
        mode_00.m_val = mode_00.m_val + 1;
        fVar6 = file_storage::end_file(this_00);
        if (fVar6.m_val <= (int)mode_00.m_val) goto LAB_00216288;
        iVar9 = file_storage::file_size(this_00,(file_index_t)mode_00.m_val);
      } while (iVar9 == 0);
      iVar9 = file_storage::file_size(this_00,(file_index_t)mode_00.m_val);
      iVar11 = iVar7;
      if (iVar9 < iVar7) {
        iVar9 = file_storage::file_size(this_00,(file_index_t)mode_00.m_val);
        iVar11 = (int)iVar9;
        if (iVar11 < 1) {
          iVar11 = 0;
        }
      }
      lVar14 = 0;
    }
    pfVar12 = (this->m_mapped_files)._M_t.
              super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
              .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
    if (pfVar12 == (file_storage *)0x0) {
      pfVar12 = this->m_files;
    }
    bVar4 = file_storage::pad_file_at(pfVar12,(file_index_t)mode_00.m_val);
    __new_size = (size_type)iVar11;
    if (bVar4) {
      iVar7 = hash_zeroes(ph,__new_size);
    }
    else {
      psVar1 = (this->m_file_priority).
               super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               .
               super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((((int)mode_00.m_val <
            *(int *)&(this->m_file_priority).
                     super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     .
                     super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (int)psVar1) &&
          (psVar1[(int)mode_00.m_val].m_val == '\0')) &&
         (bVar4 = use_partfile(this,(file_index_t)mode_00.m_val), bVar4)) {
        handle.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
        _0_4_ = 0;
        handle.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
        _4_4_ = handle.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr._4_4_ & 0xffffff00;
        handle.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             &boost::system::detail::cat_holder<void>::system_category_instance;
        pfVar12 = (this->m_mapped_files)._M_t.
                  super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
                  .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
        if (pfVar12 == (file_storage *)0x0) {
          pfVar12 = this->m_files;
        }
        pVar15 = file_storage::map_file(pfVar12,(file_index_t)mode_00.m_val,lVar14,0);
        iVar7 = part_file::hash((this->m_part_file)._M_t.
                                super___uniq_ptr_impl<libtorrent::aux::part_file,_std::default_delete<libtorrent::aux::part_file>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_libtorrent::aux::part_file_*,_std::default_delete<libtorrent::aux::part_file>_>
                                .super__Head_base<0UL,_libtorrent::aux::part_file_*,_false>.
                                _M_head_impl,ph,__new_size,pVar15.piece.m_val,pVar15.start,
                                (error_code *)&handle);
        if (handle.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr._4_1_ == '\x01') {
          (error->ec).val_ =
               handle.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr._0_4_;
          (error->ec).failed_ =
               (bool)(char)handle.
                           super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr._4_4_;
          *(int3 *)&(error->ec).field_0x5 =
               (int3)(handle.
                      super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._4_4_ >> 8);
          (error->ec).cat_ =
               (error_category *)
               handle.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          error->operation = partfile_read;
          iVar7 = -1;
        }
      }
      else {
        f = this;
        ec = error;
        open_file((mmap_storage *)&handle,(settings_interface *)this,(file_index_t)(int)sett,mode_00
                  ,(storage_error *)(ulong)mode.m_val);
        sVar13 = 0xffffffff;
        if ((error->ec).val_ == 0) {
          lVar2 = *(long *)(CONCAT44(handle.
                                     super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._4_4_,
                                     handle.
                                     super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._0_4_) + 0x20);
          if (lVar2 == 0) {
            ::std::vector<char,_std::allocator<char>_>::resize(&scratch,__new_size);
            buf.m_ptr = scratch.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish +
                        -(long)scratch.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start;
            buf.m_len = lVar14;
            uVar8 = pread_all((aux *)(ulong)*(uint *)(CONCAT44(handle.
                                                  super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._4_4_,
                                                  handle.
                                                  super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_4_) + 0x18),
                              (handle_type)
                              scratch.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,buf,(int64_t)error,&ec->ec);
            sVar13 = 0xffffffff;
            if ((error->ec).val_ == 0) {
              data.m_len = (long)scratch.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)scratch.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start;
              data.m_ptr = scratch.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start;
              lcrypto::hasher::update(ph,data);
              sVar13 = (size_type)uVar8;
            }
          }
          else {
            lVar3 = *(long *)(CONCAT44(handle.
                                       super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._4_4_,
                                       handle.
                                       super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._0_4_) + 0x10);
            sVar13 = 0;
            sVar10 = lVar3 - lVar14;
            if (sVar10 != 0 && lVar14 <= lVar3) {
              local_70 = __new_size;
              if ((long)sVar10 < (long)__new_size) {
                local_70 = sVar10;
              }
              local_78 = (char *)(lVar2 + lVar14);
              local_38 = (file_storage *)&local_78;
              local_40 = ph;
              sig::operator()((sig *)&local_40,(anon_class_16_2_14dc695b *)f);
              sVar13 = local_70;
              if ((flags.m_val & 0x10) != 0) {
                range_00.m_len = local_70;
                range_00.m_ptr = local_78;
                file_mapping::dont_need
                          ((file_mapping *)
                           CONCAT44(handle.
                                    super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._4_4_,
                                    handle.
                                    super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._0_4_),range_00);
              }
              if ((char)flags.m_val < '\0') {
                range.m_len = local_70;
                range.m_ptr = local_78;
                file_mapping::page_out
                          ((file_mapping *)
                           CONCAT44(handle.
                                    super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._4_4_,
                                    handle.
                                    super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._0_4_),range);
              }
            }
          }
        }
        iVar7 = (int)sVar13;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&handle.
                    super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
    uVar5 = (undefined1)(mode_00.m_val >> 0x10);
    if ((error->ec).val_ != 0) {
      *(short *)&error->field_0x10 = (short)mode_00.m_val;
      error->field_0x12 = uVar5;
      goto LAB_00216288;
    }
    local_80 = (disk_job *)((long)local_80 - (long)iVar7);
    lVar14 = lVar14 + iVar7;
    local_8c = local_8c + iVar7;
    if ((0 < iVar11) && (iVar7 == 0)) {
      error->operation = file_read;
      boost::system::error_code::operator=(&error->ec,eof);
      error->field_0x12 = uVar5;
      *(short *)&error->field_0x10 = (short)mode_00.m_val;
    }
  } while( true );
}

Assistant:

int mmap_storage::hash(settings_interface const& sett
		, hasher& ph, std::ptrdiff_t const len
		, piece_index_t const piece, int const offset
		, aux::open_mode_t const mode
		, disk_job_flags_t const flags
		, storage_error& error)
	{
#ifdef TORRENT_SIMULATE_SLOW_READ
		std::this_thread::sleep_for(milliseconds(rand() % 2000));
#endif

		char dummy;
		std::vector<char> scratch;

		return readwrite(files(), span<char const>{&dummy, len}, piece, offset, error
			, [this, mode, flags, &ph, &sett, &scratch](file_index_t const file_index
				, std::int64_t const file_offset
				, span<char const> const buf, storage_error& ec)
		{
			if (files().pad_file_at(file_index))
				return aux::hash_zeroes(ph, buf.size());

			if (file_index < m_file_priority.end_index()
				&& m_file_priority[file_index] == dont_download
				&& use_partfile(file_index))
			{
				error_code e;
				peer_request map = files().map_file(file_index, file_offset, 0);
				int const ret = m_part_file->hash(ph, buf.size()
					, map.piece, map.start, e);

				if (e)
				{
					ec.ec = e;
					ec.operation = operation_t::partfile_read;
					return -1;
				}
				return ret;
			}

			auto handle = open_file(sett, file_index, mode, ec);
			if (ec) return -1;

			if (!handle->has_memory_map())
			{
				scratch.resize(std::size_t(buf.size()));
				int const ret = aux::pread_all(handle->fd(), scratch, file_offset, ec.ec);
				if (ec) return -1;
				ph.update(scratch);
				return ret;
			}

			int ret = 0;
			span<byte const> file_range = handle->range();
			if (file_range.size() > file_offset)
			{
				file_range = file_range.subspan(std::ptrdiff_t(file_offset)
					, std::min(buf.size(), std::ptrdiff_t(file_range.size() - file_offset)));

				sig::try_signal([&]{
					ph.update({const_cast<char const*>(file_range.data()), file_range.size()});
				});
				ret += static_cast<int>(file_range.size());
				if (flags & disk_interface::volatile_read)
					handle->dont_need(file_range);
				if (flags & disk_interface::flush_piece)
					handle->page_out(file_range);
			}

			return ret;
		});
	}